

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall wallet::WalletBatch::ReadBestBlock(WalletBatch *this,CBlockLocator *locator)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DatabaseBatch::Read<std::__cxx11::string,CBlockLocator>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::BESTBLOCK_abi_cxx11_,locator);
  if ((bVar2) &&
     ((locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bVar2 = DatabaseBatch::Read<std::__cxx11::string,CBlockLocator>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DBKeys::BESTBLOCK_NOMERKLE_abi_cxx11_,locator);
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::ReadBestBlock(CBlockLocator& locator)
{
    if (m_batch->Read(DBKeys::BESTBLOCK, locator) && !locator.vHave.empty()) return true;
    return m_batch->Read(DBKeys::BESTBLOCK_NOMERKLE, locator);
}